

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O0

void __thiscall
Wasm::WasmBinaryReader::ReadTableSection(WasmBinaryReader *this,bool isImportSection)

{
  bool bVar1;
  uint32 maxInitial;
  uint32 maxMaximum;
  uint sourceContextId;
  LocalFunctionId functionId;
  FunctionBody *pFVar2;
  TableSectionLimits TVar3;
  ulong local_40;
  Flags local_38;
  undefined1 local_2c [8];
  TableSectionLimits limits;
  int8 elementType;
  uint32 entries;
  uint32 length;
  bool isImportSection_local;
  WasmBinaryReader *this_local;
  
  entries._3_1_ = isImportSection;
  _length = this;
  if (isImportSection) {
    limits.super_SectionLimits.maximum = 1;
  }
  else {
    limits.super_SectionLimits.maximum =
         LEB128<unsigned_int,32u>(this,(uint32 *)&stack0xffffffffffffffe8);
  }
  if (limits.super_SectionLimits.maximum < 2) {
    if (limits.super_SectionLimits.maximum == 1) {
      limits.super_SectionLimits.initial._3_1_ =
           SLEB128<char,7u>(this,(uint32 *)&stack0xffffffffffffffe8);
      if (limits.super_SectionLimits.initial._3_1_ != -0x10) {
        ThrowDecodingError(this,L"Only anyfunc type is supported. Unknown type %d",
                           (ulong)(uint)(int)limits.super_SectionLimits.initial._3_1_);
      }
      maxInitial = Limits::GetMaxTableSize();
      maxMaximum = Limits::GetMaxTableSize();
      TVar3 = ReadSectionLimitsBase<Wasm::TableSectionLimits>
                        (this,maxInitial,maxMaximum,L"table too big");
      local_40 = TVar3.super_SectionLimits._0_8_;
      local_2c = (undefined1  [8])local_40;
      local_38 = TVar3.super_SectionLimits.maximum;
      limits.super_SectionLimits.flags = local_38;
      Js::WebAssemblyModule::InitializeTable(this->m_module,(TableSectionLimits *)local_2c);
      pFVar2 = GetFunctionBody(this);
      if (pFVar2 == (FunctionBody *)0x0) {
        bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,WasmReaderPhase);
      }
      else {
        pFVar2 = GetFunctionBody(this);
        sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar2);
        pFVar2 = GetFunctionBody(this);
        functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar2);
        bVar1 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_01ec1678,WasmReaderPhase,sourceContextId,functionId);
      }
      if (bVar1) {
        Output::Print(L"Indirect table: %u to %u entries",(ulong)local_2c >> 0x20,
                      (ulong)limits.super_SectionLimits.flags);
        Output::Print(L"\n");
        Output::Flush();
      }
    }
    return;
  }
  ThrowDecodingError(this,L"Maximum of one table allowed");
}

Assistant:

void WasmBinaryReader::ReadTableSection(bool isImportSection)
{
    uint32 length;
    uint32 entries;
    if (isImportSection)
    {
        entries = 1;
    }
    else
    {
        entries = LEB128(length);
    }
    if (entries > 1)
    {
        ThrowDecodingError(_u("Maximum of one table allowed"));
    }

    if (entries == 1)
    {
        int8 elementType = SLEB128<int8, 7>(length);
        if (elementType != LanguageTypes::anyfunc)
        {
            ThrowDecodingError(_u("Only anyfunc type is supported. Unknown type %d"), elementType);
        }
        TableSectionLimits limits = ReadSectionLimitsBase<TableSectionLimits>(Limits::GetMaxTableSize(), Limits::GetMaxTableSize(), _u("table too big"));
        m_module->InitializeTable(&limits);
        TRACE_WASM_DECODER(_u("Indirect table: %u to %u entries"), limits.initial, limits.maximum);
    }
}